

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.h
# Opt level: O2

int MyGame_Example_TestJSONPrefixParsing_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int iVar1;
  
  iVar1 = flatcc_verify_string_field(td,0,0);
  if (iVar1 == 0) {
    iVar1 = flatcc_verify_field(td,1,4,4);
    if (iVar1 == 0) {
      iVar1 = flatcc_verify_string_field(td,2,0);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_field(td,3,8,8);
        if (iVar1 == 0) {
          iVar1 = flatcc_verify_string_field(td,4,0);
          if (iVar1 == 0) {
            iVar1 = flatcc_verify_field(td,5,8,8);
            if (iVar1 == 0) {
              iVar1 = flatcc_verify_field(td,6,4,4);
              if (iVar1 == 0) {
                iVar1 = flatcc_verify_field(td,7,8,8);
                if (iVar1 == 0) {
                  iVar1 = flatcc_verify_field(td,8,4,4);
                  return iVar1;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int MyGame_Example_TestJSONPrefixParsing_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_string_field(td, 0, 0) /* aaaa */)) return ret;
    if ((ret = flatcc_verify_field(td, 1, 4, 4) /* aaaa12345 */)) return ret;
    if ((ret = flatcc_verify_string_field(td, 2, 0) /* bbbb */)) return ret;
    if ((ret = flatcc_verify_field(td, 3, 8, 8) /* bbbb1234 */)) return ret;
    if ((ret = flatcc_verify_string_field(td, 4, 0) /* cccc */)) return ret;
    if ((ret = flatcc_verify_field(td, 5, 8, 8) /* cccc1234 */)) return ret;
    if ((ret = flatcc_verify_field(td, 6, 4, 4) /* cccc12345 */)) return ret;
    if ((ret = flatcc_verify_field(td, 7, 8, 8) /* dddd1234 */)) return ret;
    if ((ret = flatcc_verify_field(td, 8, 4, 4) /* dddd12345 */)) return ret;
    return flatcc_verify_ok;
}